

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

void display_feeling(_Bool obj_only)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  char *fmt;
  
  if ((player->opts).opt[0x25] != true) {
    return;
  }
  if (player->depth != 0) {
    bVar1 = cave->feeling;
    if (obj_only) {
      disturb(player);
      pcVar4 = obj_feeling_text[(ulong)bVar1 / 10];
      fmt = "You feel that %s";
    }
    else {
      uVar2 = (bVar1 / 10) * 0xfff6 + (uint)bVar1;
      if (z_info->feeling_need <= cave->feeling_squares) {
        uVar3 = 10;
        if (bVar1 < 0x6e) {
          uVar3 = bVar1 / 10;
        }
        uVar5 = 9;
        if ((uVar2 & 0xfffe) < 10) {
          uVar5 = uVar2;
        }
        pcVar4 = ", and";
        if ((ushort)uVar3 < 7 != (ushort)uVar5 < 6) {
          pcVar4 = ", yet";
        }
        msg("%s%s %s",mon_feeling_text[uVar5 & 0xffff],pcVar4,obj_feeling_text[uVar3]);
        return;
      }
      pcVar4 = mon_feeling_text[uVar2 & 0xffff];
      fmt = "%s.";
    }
    msg(fmt,pcVar4);
    return;
  }
  msg("Looks like a typical town.");
  return;
}

Assistant:

void display_feeling(bool obj_only)
{
	uint16_t obj_feeling = cave->feeling / 10;
	uint16_t mon_feeling = cave->feeling - (10 * obj_feeling);
	const char *join;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return;

	/* No useful feeling in town */
	if (!player->depth) {
		msg("Looks like a typical town.");
		return;
	}

	/* Display only the object feeling when it's first discovered. */
	if (obj_only) {
		disturb(player);
		msg("You feel that %s", obj_feeling_text[obj_feeling]);
		return;
	}

	/* Players automatically get a monster feeling. */
	if (cave->feeling_squares < z_info->feeling_need) {
		msg("%s.", mon_feeling_text[mon_feeling]);
		return;
	}

	/* Verify the feelings */
	if (obj_feeling >= N_ELEMENTS(obj_feeling_text))
		obj_feeling = N_ELEMENTS(obj_feeling_text) - 1;

	if (mon_feeling >= N_ELEMENTS(mon_feeling_text))
		mon_feeling = N_ELEMENTS(mon_feeling_text) - 1;

	/* Decide the conjunction */
	if ((mon_feeling <= 5 && obj_feeling > 6) ||
			(mon_feeling > 5 && obj_feeling <= 6))
		join = ", yet";
	else
		join = ", and";

	/* Display the feeling */
	msg("%s%s %s", mon_feeling_text[mon_feeling], join,
		obj_feeling_text[obj_feeling]);
}